

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall
testing::internal::ForkingDeathTest::ForkingDeathTest
          (ForkingDeathTest *this,char *a_statement,
          Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *matcher)

{
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_38;
  
  local_38.vtable_ =
       (matcher->
       super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
       ).vtable_;
  local_38.buffer_ =
       (matcher->
       super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
       ).buffer_;
  (matcher->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).vtable_ = (VTable *)0x0;
  local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00436ee0;
  DeathTest::DeathTest((DeathTest *)this);
  (this->super_DeathTestImpl).super_DeathTest._vptr_DeathTest =
       (_func_int **)&PTR__DeathTestImpl_004406c0;
  (this->super_DeathTestImpl).statement_ = a_statement;
  (this->super_DeathTestImpl).matcher_.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00436f50;
  (this->super_DeathTestImpl).matcher_.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .vtable_ = local_38.vtable_;
  (this->super_DeathTestImpl).matcher_.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .buffer_ = local_38.buffer_;
  local_38.vtable_ = (VTable *)0x0;
  (this->super_DeathTestImpl).matcher_.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00436ee0;
  (this->super_DeathTestImpl).spawned_ = false;
  (this->super_DeathTestImpl).status_ = -1;
  (this->super_DeathTestImpl).outcome_ = IN_PROGRESS;
  (this->super_DeathTestImpl).read_fd_ = -1;
  (this->super_DeathTestImpl).write_fd_ = -1;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_38);
  (this->super_DeathTestImpl).super_DeathTest._vptr_DeathTest =
       (_func_int **)&PTR__DeathTestImpl_00440350;
  *(undefined4 *)&(this->super_DeathTestImpl).field_0x3c = 0xffffffff;
  return;
}

Assistant:

ForkingDeathTest::ForkingDeathTest(const char* a_statement,
                                   Matcher<const std::string&> matcher)
    : DeathTestImpl(a_statement, std::move(matcher)), child_pid_(-1) {}